

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_primitives.cpp
# Opt level: O2

string * __thiscall
editor::figures::Polygon::get_representation_abi_cxx11_
          (string *__return_storage_ptr__,Polygon *this)

{
  pointer pCVar1;
  ostream *poVar2;
  Coordinate *point;
  pointer pCVar3;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"polygon: ");
  pCVar1 = (this->points).
           super__Vector_base<editor::Coordinate,_std::allocator<editor::Coordinate>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->points).
                super__Vector_base<editor::Coordinate,_std::allocator<editor::Coordinate>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    poVar2 = std::operator<<(local_1a8,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pCVar3->x);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pCVar3->y);
    std::operator<<(poVar2,") ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Polygon::get_representation() {
        std::stringstream ss;
        ss << "polygon: ";
        for (const auto& point: points)
            ss << "(" << point.x << "," << point.y << ") ";
        return ss.str();
    }